

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing.c
# Opt level: O0

void printf_btr_bxcan(can_bittiming *bt,_Bool hdr)

{
  byte in_SIL;
  long in_RDI;
  uint32_t btr;
  
  if ((in_SIL & 1) == 0) {
    printf("0x%08x",(ulong)(*(int *)(in_RDI + 0x1c) - 1U & 0x3ff |
                            ((*(int *)(in_RDI + 0xc) + *(int *)(in_RDI + 0x10)) - 1U & 0xf) << 0x10
                            | (*(int *)(in_RDI + 0x14) - 1U & 7) << 0x14 |
                           (*(int *)(in_RDI + 0x18) - 1U & 3) << 0x18));
  }
  else {
    printf("%10s","CAN_BTR");
  }
  return;
}

Assistant:

static void printf_btr_bxcan(struct can_bittiming *bt, bool hdr)
{
	if (hdr) {
		printf("%10s", "CAN_BTR");
	} else {
		uint32_t btr;

		btr = (((bt->brp -1) & 0x3ff) << 0) |
			(((bt->prop_seg + bt->phase_seg1 -1) & 0xf) << 16) |
			(((bt->phase_seg2 -1) & 0x7) << 20) |
			(((bt->sjw -1) & 0x3) << 24);

		printf("0x%08x", btr);
	}
}